

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedBreakIterator::RuleBasedBreakIterator
          (RuleBasedBreakIterator *this,UDataMemory *udm,UErrorCode *status)

{
  UBool UVar1;
  RBBIDataWrapper *this_00;
  EVP_PKEY_CTX *size;
  RBBIDataWrapper *local_98;
  UnicodeString local_60;
  EVP_PKEY_CTX *local_20;
  UErrorCode *status_local;
  UDataMemory *udm_local;
  RuleBasedBreakIterator *this_local;
  
  local_20 = (EVP_PKEY_CTX *)status;
  status_local = (UErrorCode *)udm;
  udm_local = (UDataMemory *)this;
  BreakIterator::BreakIterator(&this->super_BreakIterator);
  (this->super_BreakIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedBreakIterator_002ad440;
  UnicodeString::UnicodeString(&local_60);
  StringCharacterIterator::StringCharacterIterator(&this->fSCharIter,&local_60);
  UnicodeString::~UnicodeString(&local_60);
  size = local_20;
  init(this,local_20);
  this_00 = (RBBIDataWrapper *)UMemory::operator_new((UMemory *)0x90,(size_t)size);
  local_98 = (RBBIDataWrapper *)0x0;
  if (this_00 != (RBBIDataWrapper *)0x0) {
    RBBIDataWrapper::RBBIDataWrapper(this_00,(UDataMemory *)status_local,(UErrorCode *)local_20);
    local_98 = this_00;
  }
  this->fData = local_98;
  UVar1 = ::U_FAILURE(*(UErrorCode *)local_20);
  if ((UVar1 == '\0') && (this->fData == (RBBIDataWrapper *)0x0)) {
    *(UErrorCode *)local_20 = U_MEMORY_ALLOCATION_ERROR;
  }
  return;
}

Assistant:

RuleBasedBreakIterator::RuleBasedBreakIterator(UDataMemory* udm, UErrorCode &status)
 : fSCharIter(UnicodeString())
{
    init(status);
    fData = new RBBIDataWrapper(udm, status); // status checked in constructor
    if (U_FAILURE(status)) {return;}
    if(fData == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
}